

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedHelpers.cpp
# Opt level: O0

void __thiscall RGBValue::ConvertToControllerOrder(RGBValue *this,ColorLayout layout,U16 *values)

{
  U16 *values_local;
  ColorLayout layout_local;
  RGBValue *this_local;
  
  if (layout == LAYOUT_RGB) {
    *values = this->red;
    values[1] = this->green;
    values[2] = this->blue;
  }
  else if (layout == LAYOUT_GRB) {
    *values = this->green;
    values[1] = this->red;
    values[2] = this->blue;
  }
  return;
}

Assistant:

void RGBValue::ConvertToControllerOrder( ColorLayout layout, U16* values ) const
{
    switch( layout )
    {
    case LAYOUT_GRB:
        values[ 0 ] = green;
        values[ 1 ] = red;
        values[ 2 ] = blue;
        break;

    case LAYOUT_RGB:
        values[ 0 ] = red;
        values[ 1 ] = green;
        values[ 2 ] = blue;
        break;
    }
}